

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::ImageFeatureType_ImageSize::ByteSizeLong(ImageFeatureType_ImageSize *this)

{
  int iVar1;
  uint64 uVar2;
  size_t sVar3;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  ImageFeatureType_ImageSize *this_local;
  
  sStack_18 = 0;
  uVar2 = width(this);
  if (uVar2 != 0) {
    uVar2 = width(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar2);
    sStack_18 = sStack_18 + 1;
  }
  uVar2 = height(this);
  if (uVar2 != 0) {
    uVar2 = height(this);
    sVar3 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar2);
    sStack_18 = sVar3 + 1 + sStack_18;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t ImageFeatureType_ImageSize::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ImageFeatureType.ImageSize)
  size_t total_size = 0;

  // uint64 width = 1;
  if (this->width() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->width());
  }

  // uint64 height = 2;
  if (this->height() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->height());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}